

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O0

int CompareFsm(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,int fxdSilfVersionB,
              int fxdSilfVersionT,int iPass)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  long *in_RCX;
  long *in_RDX;
  TestCase *in_RSI;
  string *in_RDI;
  undefined4 in_stack_00000008;
  int ic;
  int cStartStates;
  int critMaxRulePreContext;
  int critMinRulePreContext;
  int i;
  int crulInMap;
  int imcr;
  int cmcr;
  int ccol;
  int crowNonAcpt;
  int crowFinal;
  int crowSuccess;
  int crowTransitional;
  int crow;
  allocator *in_stack_fffffffffffff898;
  int iVar8;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  allocator *in_stack_fffffffffffff8a8;
  string *in_stack_fffffffffffff8b0;
  TestCase *in_stack_fffffffffffff8b8;
  allocator *in_stack_fffffffffffff8c0;
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [36];
  int local_504;
  int local_500;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [32];
  uint local_4b0;
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [32];
  uint local_460;
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [36];
  int local_3bc;
  uint local_3b8;
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [32];
  int local_2c8;
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [32];
  int local_188;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  int local_138;
  int local_134;
  int local_130;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  int local_e0;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  int local_90;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  int local_2c;
  long *local_20;
  long *local_18;
  TestCase *local_10;
  string *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar3 = (**(code **)(*in_RDX + 0x10))();
  local_2c = (int)sVar3;
  sVar4 = (**(code **)(*local_20 + 0x10))();
  iVar8 = (int)((ulong)in_stack_fffffffffffff898 >> 0x20);
  if ((int)sVar3 != (int)sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"ERROR: pass FSM",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88," - number of FSM states",&local_89);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  sVar3 = (**(code **)(*local_18 + 0x10))();
  local_90 = (int)sVar3;
  sVar4 = (**(code **)(*local_20 + 0x10))();
  if ((int)sVar3 != (int)sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"ERROR: pass FSM",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8," - number of FSM transitional states",&local_d9);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  sVar3 = (**(code **)(*local_18 + 0x10))();
  local_e0 = (int)sVar3;
  sVar4 = (**(code **)(*local_20 + 0x10))();
  if ((int)sVar3 != (int)sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"ERROR: pass FSM",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128," - number of FSM success states",&local_129);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  local_130 = local_2c - local_90;
  local_134 = local_2c - local_e0;
  sVar3 = (**(code **)(*local_18 + 0x10))();
  local_138 = (int)sVar3;
  sVar4 = (**(code **)(*local_20 + 0x10))();
  if ((int)sVar3 != (int)sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"ERROR: pass FSM",&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180," - number of FSM columns",&local_181);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  sVar3 = (**(code **)(*local_18 + 0x10))();
  local_188 = (int)sVar3;
  sVar4 = (**(code **)(*local_20 + 0x10))();
  if ((int)sVar3 != (int)sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"ERROR: pass FSM",&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0," - # of glyph ranges",&local_1d1);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  }
  sVar3 = (**(code **)(*local_18 + 0x10))();
  sVar4 = (**(code **)(*local_20 + 0x10))();
  if (sVar3 != sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"ERROR: pass FSM",&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220," - glyph range search increment",&local_221);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  sVar3 = (**(code **)(*local_18 + 0x10))();
  sVar4 = (**(code **)(*local_20 + 0x10))();
  if (sVar3 != sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"ERROR: pass FSM",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270," - glyph range search loop",&local_271);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
  }
  sVar3 = (**(code **)(*local_18 + 0x10))();
  sVar4 = (**(code **)(*local_20 + 0x10))();
  if (sVar3 != sVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"ERROR: pass FSM",&local_299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0," - glyph range search start",&local_2c1);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
  }
  for (local_2c8 = 0; local_2c8 < local_188; local_2c8 = local_2c8 + 1) {
    sVar3 = (**(code **)(*local_18 + 0x18))();
    sVar4 = (**(code **)(*local_20 + 0x18))();
    if (sVar3 != sVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"ERROR: pass FSM",&local_2e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_310," - glyph range first",&local_311);
      OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                  in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                  (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    }
    sVar3 = (**(code **)(*local_18 + 0x18))();
    sVar4 = (**(code **)(*local_20 + 0x18))();
    if (sVar3 != sVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_338,"ERROR: pass FSM",&local_339);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_360," - glyph range last",&local_361);
      OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                  in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                  (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
    }
    sVar3 = (**(code **)(*local_18 + 0x18))();
    sVar4 = (**(code **)(*local_20 + 0x18))();
    if (sVar3 != sVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_388,"ERROR: pass FSM",&local_389);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b0," - glyph range column",&local_3b1);
      OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                  in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                  (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator((allocator<char> *)&local_389);
    }
  }
  for (local_3bc = 0; local_3bc < local_e0 + 1; local_3bc = local_3bc + 1) {
    uVar5 = (**(code **)(*local_18 + 0x18))();
    local_3b8 = (uint)uVar5;
    uVar6 = (**(code **)(*local_20 + 0x18))();
    if ((uint)uVar5 != (uint)uVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,"ERROR: pass FSM",&local_3e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408," - rule map offset",&local_409);
      OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                  in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                  (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
      std::__cxx11::string::~string(local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    }
  }
  for (local_3bc = 0; local_3bc < (int)local_3b8; local_3bc = local_3bc + 1) {
    sVar3 = (**(code **)(*local_18 + 0x18))();
    sVar4 = (**(code **)(*local_20 + 0x18))();
    if (sVar3 != sVar4) {
      in_stack_fffffffffffff8c0 = &local_431;
      in_stack_fffffffffffff8b0 = local_8;
      in_stack_fffffffffffff8b8 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_430,"ERROR: pass FSM",in_stack_fffffffffffff8c0);
      in_stack_fffffffffffff8a8 = &local_459;
      in_stack_fffffffffffff8a4 = in_stack_00000008;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_458," - rule map item",in_stack_fffffffffffff8a8);
      OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                  in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                  (string *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),iVar8);
      std::__cxx11::string::~string(local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
      std::__cxx11::string::~string(local_430);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
    }
  }
  bVar1 = (**(code **)(*local_18 + 8))();
  uVar7 = (uint)bVar1;
  local_460 = uVar7;
  bVar1 = (**(code **)(*local_20 + 8))();
  if (uVar7 != bVar1) {
    in_stack_fffffffffffff898 = &local_481;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"ERROR: pass FSM",in_stack_fffffffffffff898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a8," - min rule pre-context",&local_4a9);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,uVar7),
                (int)((ulong)in_stack_fffffffffffff898 >> 0x20));
    std::__cxx11::string::~string(local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
  }
  bVar1 = (**(code **)(*local_18 + 8))();
  local_4b0 = (uint)bVar1;
  bVar2 = (**(code **)(*local_20 + 8))();
  iVar8 = (int)((ulong)in_stack_fffffffffffff898 >> 0x20);
  if ((uint)bVar1 != (uint)bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d0,"ERROR: pass FSM",&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8," - max rule pre-context",&local_4f9);
    OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0
                ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                (string *)CONCAT44(in_stack_fffffffffffff8a4,uVar7),iVar8);
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  }
  local_500 = (local_4b0 - local_460) + 1;
  for (local_504 = 0; local_504 < local_500; local_504 = local_504 + 1) {
    sVar3 = (**(code **)(*local_18 + 0x10))();
    sVar4 = (**(code **)(*local_20 + 0x10))();
    if (sVar3 != sVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_528,"ERROR: pass FSM",&local_529);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_550," - start state",&local_551);
      OutputError((int *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                  in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                  (string *)CONCAT44(in_stack_fffffffffffff8a4,uVar7),iVar8);
      std::__cxx11::string::~string(local_550);
      std::allocator<char>::~allocator((allocator<char> *)&local_551);
      std::__cxx11::string::~string(local_528);
      std::allocator<char>::~allocator((allocator<char> *)&local_529);
    }
  }
  return (local_2c - local_130) * local_138;
}

Assistant:

int CompareFsm(int & ec, TestCase * ptcase,
	GrIStream & grstrmB, GrIStream & grstrmT,
	int fxdSilfVersionB, int fxdSilfVersionT, int iPass)
{
	//	number of FSM states
	int crow = grstrmB.ReadShortFromFont();
	if (crow != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM states");
	//	number of transitional states
	int crowTransitional = grstrmB.ReadShortFromFont();
	if (crowTransitional != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM transitional states");
	//	number of success states
	int crowSuccess = grstrmB.ReadShortFromFont();
	if (crowSuccess != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM success states");
	int crowFinal = crow - crowTransitional;
	int crowNonAcpt = crow - crowSuccess;

	//	number of columns
	int ccol = grstrmB.ReadShortFromFont();
	if (ccol != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM columns");

	// Sanity check
	Assert(crowTransitional <= crow && crowSuccess <= crow);

	//	number of FSM glyph ranges and search constants
	int cmcr = grstrmB.ReadShortFromFont();
	if (cmcr != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - # of glyph ranges");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search increment");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search loop");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search start");

	for (int imcr = 0; imcr < cmcr; imcr++)
	{
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range first", imcr);
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range last", imcr);
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range column", imcr);
	}

	// rule map and offsets (extra item at end gives final offset, ie, total)
	int crulInMap;
	int i;
	for (i = 0; i < (crowSuccess + 1); i++)
	{
		crulInMap = grstrmB.ReadUShortFromFont();	// last offset functions as the total length of the rule list
		if (crulInMap != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - rule map offset", i);
	}

	for (i = 0; i < crulInMap; i++)
	{
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - rule map item", i);
	}

	//	min rule pre-context number of items
	int critMinRulePreContext = grstrmB.ReadByteFromFont();
	if (critMinRulePreContext != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - min rule pre-context", i);
	int critMaxRulePreContext = grstrmB.ReadByteFromFont();
	if (critMaxRulePreContext != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - max rule pre-context", i);

	Assert(critMinRulePreContext <= kMaxSlotsPerRule);
	Assert(critMaxRulePreContext <= kMaxSlotsPerRule);

	int cStartStates = critMaxRulePreContext - critMinRulePreContext + 1;

	//	start states
	for (int ic = 0; ic < cStartStates;	ic++)
	{
		if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - start state", ic);
	}

	return (crow - crowFinal) * ccol;
}